

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::CopyFileIfDifferent(string *source,string *destination)

{
  bool bVar1;
  Status SVar2;
  undefined1 local_40 [8];
  string new_destination;
  string *destination_local;
  string *source_local;
  
  new_destination.field_2._8_8_ = destination;
  bVar1 = FileIsDirectory(destination);
  if (bVar1) {
    FileInDir((string *)local_40,source,(string *)new_destination.field_2._8_8_);
    bVar1 = ComparePath((string *)local_40,(string *)new_destination.field_2._8_8_);
    if (!bVar1) {
      source_local = (string *)CopyFileIfDifferent(source,(string *)local_40);
    }
    std::__cxx11::string::~string((string *)local_40);
    if (!bVar1) {
      return (Status)source_local;
    }
  }
  else {
    bVar1 = FilesDiffer(source,(string *)new_destination.field_2._8_8_);
    if (bVar1) {
      SVar2 = CopyFileAlways(source,(string *)new_destination.field_2._8_8_);
      return SVar2;
    }
  }
  SVar2 = Status::Success();
  return SVar2;
}

Assistant:

Status SystemTools::CopyFileIfDifferent(std::string const& source,
                                        std::string const& destination)
{
  // special check for a destination that is a directory
  // FilesDiffer does not handle file to directory compare
  if (SystemTools::FileIsDirectory(destination)) {
    const std::string new_destination = FileInDir(source, destination);
    if (!SystemTools::ComparePath(new_destination, destination)) {
      return SystemTools::CopyFileIfDifferent(source, new_destination);
    }
  } else {
    // source and destination are files so do a copy if they
    // are different
    if (SystemTools::FilesDiffer(source, destination)) {
      return SystemTools::CopyFileAlways(source, destination);
    }
  }
  // at this point the files must be the same so return true
  return Status::Success();
}